

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SubDVertex * __thiscall
ON_SubD::FindOrAddVertex(ON_SubD *this,double *control_net_point,double distance_tolerance)

{
  bool bVar1;
  ON_SubDVertex *pOVar2;
  ON_3dPoint P;
  ON_3dPoint local_28;
  
  if (control_net_point != (double *)0x0) {
    ON_3dPoint::ON_3dPoint(&local_28,control_net_point);
    bVar1 = ON_3dPoint::IsValid(&local_28);
    if (distance_tolerance < 0.0 || !bVar1) {
      pOVar2 = (ON_SubDVertex *)0x0;
    }
    else {
      pOVar2 = FindVertex(this,&local_28.x,distance_tolerance);
      if (pOVar2 == (ON_SubDVertex *)0x0) {
        pOVar2 = AddVertex(this,Unset,&local_28.x);
      }
    }
    return pOVar2;
  }
  return (ON_SubDVertex *)0x0;
}

Assistant:

const ON_SubDVertex* ON_SubD::FindOrAddVertex(
  const double* control_net_point,
  double distance_tolerance
)
{
  if (nullptr == control_net_point)
    return nullptr;
  const ON_3dPoint P(control_net_point);
  if (false == P.IsValid())
    return nullptr;
  if (false == (0.0 <= distance_tolerance))
    return nullptr;
  const ON_SubDVertex* v = FindVertex(&P.x, distance_tolerance);
  return (nullptr != v) ? v : AddVertex(&P.x);
}